

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

idx_t duckdb::DictionaryCompression::RequiredSpace
                (idx_t current_count,idx_t index_count,idx_t dict_size,
                bitpacking_width_t packing_width)

{
  idx_t iVar1;
  
  iVar1 = BitpackingPrimitives::GetRequiredSize(current_count,packing_width);
  return iVar1 + dict_size + index_count * 4 + 0x14;
}

Assistant:

idx_t DictionaryCompression::RequiredSpace(idx_t current_count, idx_t index_count, idx_t dict_size,
                                           bitpacking_width_t packing_width) {
	idx_t base_space = DICTIONARY_HEADER_SIZE + dict_size;
	idx_t string_number_space = BitpackingPrimitives::GetRequiredSize(current_count, packing_width);
	idx_t index_space = index_count * sizeof(uint32_t);

	idx_t used_space = base_space + index_space + string_number_space;

	return used_space;
}